

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void read_bytes<unsigned_long,unsigned_int>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vec,size_t n_els,istream *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  pointer puVar1;
  pointer pcVar2;
  unsigned_long *ptr_write;
  size_t sVar3;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(vec,n_els);
  if ((vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
    _S_do_it(vec);
  }
  if (n_els != 0) {
    if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start) < n_els * 4) {
      std::vector<char,_std::allocator<char>_>::resize(buffer,n_els * 8);
    }
    std::istream::read((char *)in,
                       (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                             super__Vector_impl_data._M_start);
    if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 1) != 0) {
      throw_errno();
    }
    if (diff_endian) {
      read_bytes<unsigned_long,unsigned_int>();
    }
    puVar1 = (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = 0;
    do {
      puVar1[sVar3] = (ulong)*(uint *)(pcVar2 + sVar3 * 4);
      sVar3 = sVar3 + 1;
    } while (n_els != sVar3);
  }
  return;
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, std::istream &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(vec, n_els, in);
        if (unlikely(diff_endian)) swap_endianness(vec.data(), n_els);
        return;
    }
    vec.resize(n_els);
    vec.shrink_to_fit();

    if (n_els) {
        if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
            buffer.resize((size_t)2 * n_els * sizeof(saved_type));
        in.read(buffer.data(), n_els * sizeof(saved_type));
        if (unlikely(in.bad())) throw_errno();

        if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
        convert_dtype<dtype, saved_type>(vec.data(), buffer, n_els);
    }
}